

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall xmrig::Client::Client(Client *this,int id,char *agent,IClientListener *listener)

{
  long lVar1;
  mapped_type *ppCVar2;
  Dns *this_00;
  
  BaseClient::BaseClient(&this->super_BaseClient,id,listener);
  (this->super_BaseClient).super_IClient._vptr_IClient = (_func_int **)&PTR__Client_001ac220;
  (this->super_IDnsListener)._vptr_IDnsListener = (_func_int **)&PTR__Client_001ac310;
  (this->super_ILineListener)._vptr_ILineListener = (_func_int **)&PTR__Client_001ac338;
  memset(this->m_sendBuf,0,0x800);
  this->m_agent = agent;
  memset(&this->m_recvBuf,0,0x4058);
  ppCVar2 = std::
            map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
            ::operator[]((map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
                          *)m_storage,(key_type *)(m_storage + 0x30));
  *ppCVar2 = this;
  lVar1 = m_storage._48_8_ + 1;
  this->m_key = m_storage._48_8_;
  m_storage._48_8_ = lVar1;
  this_00 = (Dns *)operator_new(0x90);
  Dns::Dns(this_00,&this->super_IDnsListener);
  this->m_dns = this_00;
  return;
}

Assistant:

xmrig::Client::Client(int id, const char *agent, IClientListener *listener) :
    BaseClient(id, listener),
    m_agent(agent)
{
    m_key = m_storage.add(this);
    m_dns = new Dns(this);
}